

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::UInt64ToString(string *macro_prefix,uint64 number)

{
  AlphaNum *in_RDX;
  AlphaNum *in_RSI;
  AlphaNum *in_RDI;
  AlphaNum *this;
  AlphaNum *in_stack_ffffffffffffffe0;
  AlphaNum *a;
  
  this = in_RDI;
  a = in_RDI;
  strings::AlphaNum::AlphaNum(in_RDI,(string *)in_RDI);
  strings::AlphaNum::AlphaNum(this,(char *)in_RDI);
  strings::AlphaNum::AlphaNum(this,(unsigned_long)in_RDI);
  strings::AlphaNum::AlphaNum(this,(char *)in_RDI);
  StrCat_abi_cxx11_(a,in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  return (string *)this;
}

Assistant:

std::string UInt64ToString(const std::string& macro_prefix, uint64 number) {
  return StrCat(macro_prefix, "_ULONGLONG(", number, ")");
}